

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O1

bool asmjit::v1_14::a64::pickFpOpcode
               (Vec *reg,uint32_t sOp,uint32_t sHf,uint32_t vOp,uint32_t vHf,Opcode *opcode)

{
  Signature SVar1;
  uint uVar2;
  uint uVar3;
  
  SVar1._bits = (reg->super_BaseVec).super_Reg.super_BaseReg.super_Operand.super_Operand_._signature
                ._bits;
  uVar2 = SVar1._bits >> 3 & 0x1f;
  if ((SVar1._bits & 0x7000) == 0) {
    uVar2 = uVar2 - 9;
    if (2 < uVar2) {
      return false;
    }
    if ((pickFpOpcode::szBits[sHf].sizeMask >> (uVar2 & 0x1f) & 1) == 0) {
      return false;
    }
    uVar2 = *(uint *)((ulong)sHf * 0x10 + 0x153bc4 + (ulong)uVar2 * 4) ^ sOp;
    vOp = sOp;
  }
  else {
    uVar2 = uVar2 - 0xb;
    uVar3 = (SVar1._bits >> 0xc & 7) - 2;
    if ((2 < uVar3 || 1 < uVar2) ||
       ((pickFpOpcode::szBits[vHf].sizeMask >> (uVar3 & 0x1f) & 1) == 0)) {
      return false;
    }
    uVar2 = (uVar2 * 0x40000000 | vOp) ^ *(uint *)((ulong)vHf * 0x10 + 0x153bc4 + (ulong)uVar3 * 4);
  }
  opcode->v = uVar2;
  return vOp != 0;
}

Assistant:

static inline bool pickFpOpcode(const Vec& reg, uint32_t sOp, uint32_t sHf, uint32_t vOp, uint32_t vHf, Opcode* opcode, uint32_t* szOut) noexcept {
  static constexpr uint32_t kQBitIndex = 30;

  static const EncodeFpOpcodeBits szBits[InstDB::kHF_Count] = {
    { B(2) | B(1)       , { 0u                           , 0u, B(22) } },
    { B(2) | B(1) | B(0), { 0u                           , 0u, 0u    } },
    { B(2) | B(1) | B(0), { B(23) | B(22)                , 0u, B(22) } },
    { B(2) | B(1) | B(0), { B(22) | B(20) | B(19)        , 0u, B(22) } },
    { B(2) | B(1) | B(0), { B(22) | B(21) | B(15) | B(14), 0u, B(22) } },
    { B(2) | B(1) | B(0), { B(23)                        , 0u, B(22) } }
  };

  if (!reg.hasElementType()) {
    // Scalar operation [HSD].
    uint32_t sz = diff(reg.type(), RegType::kARM_VecH);
    if (sz > 2u || !Support::bitTest(szBits[sHf].sizeMask, sz))
      return false;

    opcode->reset(szBits[sHf].mask[sz] ^ sOp);
    *szOut = sz;
    return sOp != 0;
  }
  else {
    // Vector operation [HSD].
    uint32_t q = diff(reg.type(), RegType::kARM_VecD);
    uint32_t sz = diff(reg.elementType(), VecElementType::kH);

    if (q > 1u || sz > 2u || !Support::bitTest(szBits[vHf].sizeMask, sz))
      return false;

    opcode->reset(szBits[vHf].mask[sz] ^ (vOp | (q << kQBitIndex)));
    *szOut = sz;
    return vOp != 0;
  }
}